

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExpressionRef
BinaryenI31Get(BinaryenModuleRef module,BinaryenExpressionRef i31,bool signed_)

{
  I31Get *pIVar1;
  Builder local_10;
  
  local_10.wasm = module;
  pIVar1 = wasm::Builder::makeI31Get(&local_10,i31,signed_);
  return (BinaryenExpressionRef)pIVar1;
}

Assistant:

BinaryenExpressionRef BinaryenI31Get(BinaryenModuleRef module,
                                     BinaryenExpressionRef i31,
                                     bool signed_) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeI31Get((Expression*)i31, signed_ != 0));
}